

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O3

void ncnn::convdw3x3s2_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 (*pauVar1) [12];
  float *pfVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [12];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  uint uVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  int iVar83;
  long lVar84;
  float *pfVar85;
  uint uVar86;
  int iVar87;
  uint uVar88;
  long lVar89;
  int iVar90;
  long lVar91;
  float *pfVar92;
  float *pfVar93;
  float *pfVar94;
  void *pvVar95;
  int *piVar99;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar17 = bottom_blob->c;
  if (0 < (long)iVar17) {
    uVar18 = top_blob->w;
    iVar19 = top_blob->h;
    iVar83 = (bottom_blob->w - uVar18) * 8;
    lVar91 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        pvVar95 = (void *)0x0;
        piVar99 = (int *)0x0;
      }
      else {
        pvVar95 = (&_bias->data)[lVar91 * 2];
        piVar99 = (int *)(&_bias->data + lVar91 * 2)[1];
      }
      local_128 = SUB84(pvVar95,0);
      fStack_124 = (float)((ulong)pvVar95 >> 0x20);
      fStack_120 = SUB84(piVar99,0);
      fStack_11c = (float)((ulong)piVar99 >> 0x20);
      if (0 < iVar19) {
        pfVar94 = (float *)(top_blob->cstep * lVar91 * top_blob->elemsize + (long)top_blob->data);
        lVar84 = kernel->w * lVar91 * kernel->elemsize;
        pvVar95 = kernel->data;
        pauVar1 = (undefined1 (*) [12])((long)pvVar95 + lVar84);
        auVar80 = *pauVar1;
        local_a8 = (float)*(undefined8 *)*pauVar1;
        fStack_a4 = (float)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
        fStack_a0 = (float)*(undefined8 *)(*pauVar1 + 8);
        fStack_9c = (float)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
        auVar12 = *(undefined1 (*) [16])((long)pvVar95 + lVar84 + 0x10);
        pauVar1 = (undefined1 (*) [12])((long)pvVar95 + lVar84 + 0x20);
        auVar81 = *pauVar1;
        auVar78 = *pauVar1;
        pfVar85 = (float *)((long)pvVar95 + lVar84 + 0x30);
        fVar74 = *pfVar85;
        fVar75 = pfVar85[1];
        fVar76 = pfVar85[2];
        fVar77 = pfVar85[3];
        pauVar4 = (undefined1 (*) [12])((long)pvVar95 + lVar84 + 0x40);
        auVar82 = *pauVar4;
        auVar79 = *pauVar4;
        auVar13 = *(undefined1 (*) [16])((long)pvVar95 + lVar84 + 0x50);
        pfVar85 = (float *)((long)pvVar95 + lVar84 + 0x60);
        fVar70 = *pfVar85;
        fVar71 = pfVar85[1];
        fVar72 = pfVar85[2];
        fVar73 = pfVar85[3];
        auVar14 = *(undefined1 (*) [16])((long)pvVar95 + lVar84 + 0x70);
        auVar15 = *(undefined1 (*) [16])((long)pvVar95 + lVar84 + 0x80);
        pfVar92 = (float *)(bottom_blob->cstep * lVar91 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        lVar84 = (long)bottom_blob->w * bottom_blob->elemsize;
        pfVar85 = (float *)((long)pfVar92 + lVar84 * 2);
        pfVar93 = (float *)(lVar84 + (long)pfVar92);
        iVar90 = 0;
        local_c8 = (float)*(undefined8 *)*pauVar1;
        fStack_c4 = (float)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
        fStack_c0 = (float)*(undefined8 *)(*pauVar1 + 8);
        fStack_bc = (float)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
        local_d8 = (float)*(undefined8 *)*pauVar4;
        fStack_d4 = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
        fStack_d0 = (float)*(undefined8 *)(*pauVar4 + 8);
        fStack_cc = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
        do {
          fStack_104 = auVar12._4_4_;
          fStack_100 = auVar12._8_4_;
          fStack_fc = auVar12._12_4_;
          local_78 = auVar15._0_4_;
          fStack_74 = auVar15._4_4_;
          fStack_70 = auVar15._8_4_;
          fStack_6c = auVar15._12_4_;
          local_e8 = auVar13._0_4_;
          fStack_e4 = auVar13._4_4_;
          fStack_e0 = auVar13._8_4_;
          fStack_dc = auVar13._12_4_;
          local_b8 = auVar14._0_4_;
          fStack_b4 = auVar14._4_4_;
          fStack_b0 = auVar14._8_4_;
          fStack_ac = auVar14._12_4_;
          local_108 = auVar12._0_4_;
          if ((int)uVar18 < 4) {
            uVar88 = 0;
          }
          else {
            iVar87 = 3;
            do {
              fVar20 = pfVar92[1];
              fVar21 = pfVar92[2];
              fVar22 = pfVar92[3];
              fVar23 = pfVar92[5];
              fVar24 = pfVar92[6];
              fVar25 = pfVar92[7];
              fVar26 = pfVar92[8];
              fVar27 = pfVar92[9];
              fVar28 = pfVar92[10];
              fVar29 = pfVar92[0xb];
              fVar30 = pfVar93[1];
              fVar31 = pfVar93[2];
              fVar32 = pfVar93[3];
              fVar33 = pfVar93[5];
              fVar34 = pfVar93[6];
              fVar35 = pfVar93[7];
              fVar36 = pfVar93[8];
              fVar37 = pfVar93[9];
              fVar38 = pfVar93[10];
              fVar39 = pfVar93[0xb];
              fVar40 = pfVar85[1];
              fVar41 = pfVar85[2];
              fVar42 = pfVar85[3];
              fVar43 = pfVar85[5];
              fVar44 = pfVar85[6];
              fVar45 = pfVar85[7];
              fVar46 = pfVar92[0xc];
              fVar47 = pfVar92[0xd];
              fVar48 = pfVar92[0xe];
              fVar49 = pfVar92[0xf];
              fVar50 = pfVar85[8];
              fVar51 = pfVar85[9];
              fVar52 = pfVar85[10];
              fVar53 = pfVar85[0xb];
              fVar54 = pfVar93[0xc];
              fVar55 = pfVar93[0xd];
              fVar56 = pfVar93[0xe];
              fVar57 = pfVar93[0xf];
              fVar58 = pfVar85[0xc];
              fVar59 = pfVar85[0xd];
              fVar60 = pfVar85[0xe];
              fVar61 = pfVar85[0xf];
              fVar62 = pfVar93[0x10];
              fVar63 = pfVar93[0x11];
              fVar64 = pfVar93[0x12];
              fVar65 = pfVar93[0x13];
              local_48 = (float)*(undefined8 *)(pfVar92 + 0x10);
              fStack_44 = (float)((ulong)*(undefined8 *)(pfVar92 + 0x10) >> 0x20);
              fStack_40 = (float)*(undefined8 *)(pfVar92 + 0x12);
              fStack_3c = (float)((ulong)*(undefined8 *)(pfVar92 + 0x12) >> 0x20);
              fVar66 = pfVar85[0x10];
              fVar67 = pfVar85[0x11];
              fVar68 = pfVar85[0x12];
              fVar69 = pfVar85[0x13];
              *pfVar94 = local_a8 * *pfVar92 + local_128 +
                         local_108 * pfVar92[4] + fVar26 * local_c8 +
                         fVar36 * local_e8 + fVar74 * *pfVar93 + local_d8 * pfVar93[4] +
                         fVar70 * *pfVar85 + local_b8 * pfVar85[4] + fVar50 * local_78;
              pfVar94[1] = fStack_a4 * fVar20 + fStack_124 +
                           fStack_104 * fVar23 + fVar27 * fStack_c4 +
                           fVar37 * fStack_e4 + fVar75 * fVar30 + fStack_d4 * fVar33 +
                           fVar71 * fVar40 + fStack_b4 * fVar43 + fVar51 * fStack_74;
              pfVar94[2] = fStack_a0 * fVar21 + fStack_120 +
                           fStack_100 * fVar24 + fVar28 * fStack_c0 +
                           fVar38 * fStack_e0 + fVar76 * fVar31 + fStack_d0 * fVar34 +
                           fVar72 * fVar41 + fStack_b0 * fVar44 + fVar52 * fStack_70;
              pfVar94[3] = fStack_9c * fVar22 + fStack_11c + fStack_fc * fVar25 + fVar29 * fStack_bc
                           + fVar39 * fStack_dc + fVar77 * fVar32 + fStack_cc * fVar35 +
                           fVar73 * fVar42 + fStack_ac * fVar45 + fVar53 * fStack_6c;
              auVar98 = *(undefined1 (*) [16])(pfVar92 + 0x18);
              auVar16 = *(undefined1 (*) [16])(pfVar93 + 0x18);
              fVar20 = pfVar85[0x18];
              fVar21 = pfVar85[0x19];
              fVar22 = pfVar85[0x1a];
              fVar23 = pfVar85[0x1b];
              fVar24 = pfVar92[0x14];
              fVar25 = pfVar92[0x15];
              fVar30 = pfVar92[0x16];
              fVar31 = pfVar92[0x17];
              fVar32 = pfVar93[0x14];
              fVar33 = pfVar93[0x15];
              fVar34 = pfVar93[0x16];
              fVar35 = pfVar93[0x17];
              fVar40 = pfVar85[0x14];
              fVar41 = pfVar85[0x15];
              fVar42 = pfVar85[0x16];
              fVar43 = pfVar85[0x17];
              pfVar94[4] = fVar26 * local_a8 + local_128 + fVar36 * fVar74 + fVar50 * fVar70 +
                           local_d8 * fVar54 + local_108 * fVar46 + local_b8 * fVar58 +
                           local_48 * local_c8 + fVar62 * local_e8 + local_78 * fVar66;
              pfVar94[5] = fVar27 * fStack_a4 + fStack_124 + fVar37 * fVar75 + fVar51 * fVar71 +
                           fStack_d4 * fVar55 + fStack_104 * fVar47 + fStack_b4 * fVar59 +
                           fStack_44 * fStack_c4 + fVar63 * fStack_e4 + fStack_74 * fVar67;
              pfVar94[6] = fVar28 * fStack_a0 + fStack_120 + fVar38 * fVar76 + fVar52 * fVar72 +
                           fStack_d0 * fVar56 + fStack_100 * fVar48 + fStack_b0 * fVar60 +
                           fStack_40 * fStack_c0 + fVar64 * fStack_e0 + fStack_70 * fVar68;
              pfVar94[7] = fVar29 * fStack_9c + fStack_11c + fVar39 * fVar77 + fVar53 * fVar73 +
                           fStack_cc * fVar57 + fStack_fc * fVar49 + fStack_ac * fVar61 +
                           fStack_3c * fStack_bc + fVar65 * fStack_dc + fStack_6c * fVar69;
              fVar26 = pfVar92[0x1c];
              fVar27 = pfVar92[0x1d];
              fVar28 = pfVar92[0x1e];
              fVar29 = pfVar92[0x1f];
              fVar36 = pfVar92[0x20];
              fVar37 = pfVar92[0x21];
              fVar38 = pfVar92[0x22];
              fVar39 = pfVar92[0x23];
              fVar44 = pfVar93[0x1c];
              fVar45 = pfVar93[0x1d];
              fVar46 = pfVar93[0x1e];
              fVar47 = pfVar93[0x1f];
              fVar48 = pfVar93[0x20];
              fVar49 = pfVar93[0x21];
              fVar50 = pfVar93[0x22];
              fVar51 = pfVar93[0x23];
              fVar52 = pfVar85[0x1c];
              fVar53 = pfVar85[0x1d];
              fVar54 = pfVar85[0x1e];
              fVar55 = pfVar85[0x1f];
              fVar56 = pfVar85[0x20];
              fVar57 = pfVar85[0x21];
              fVar58 = pfVar85[0x22];
              fVar59 = pfVar85[0x23];
              pfVar94[8] = local_a8 * local_48 + local_128 + fVar62 * fVar74 + fVar66 * fVar70 +
                           local_108 * fVar24 + local_d8 * fVar32 + local_b8 * fVar40 +
                           fVar20 * local_78 + auVar16._0_4_ * local_e8 + auVar98._0_4_ * local_c8;
              pfVar94[9] = fStack_a4 * fStack_44 + fStack_124 + fVar63 * fVar75 + fVar67 * fVar71 +
                           fStack_104 * fVar25 + fStack_d4 * fVar33 + fStack_b4 * fVar41 +
                           fVar21 * fStack_74 +
                           auVar16._4_4_ * fStack_e4 + auVar98._4_4_ * fStack_c4;
              pfVar94[10] = fStack_a0 * fStack_40 + fStack_120 + fVar64 * fVar76 + fVar68 * fVar72 +
                            fStack_100 * fVar30 + fStack_d0 * fVar34 + fStack_b0 * fVar42 +
                            fVar22 * fStack_70 +
                            auVar16._8_4_ * fStack_e0 + auVar98._8_4_ * fStack_c0;
              pfVar94[0xb] = fStack_9c * fStack_3c + fStack_11c + fVar65 * fVar77 + fVar69 * fVar73
                             + fStack_fc * fVar31 + fStack_cc * fVar35 + fStack_ac * fVar43 +
                             fVar23 * fStack_6c +
                             auVar16._12_4_ * fStack_dc + auVar98._12_4_ * fStack_bc;
              auVar96._0_4_ =
                   auVar98._0_4_ * local_a8 + local_128 + auVar16._0_4_ * fVar74 + fVar20 * fVar70 +
                   local_b8 * fVar52 + local_108 * fVar26 + local_d8 * fVar44 +
                   local_e8 * fVar48 + local_c8 * fVar36 + local_78 * fVar56;
              auVar96._4_4_ =
                   auVar98._4_4_ * fStack_a4 + fStack_124 + auVar16._4_4_ * fVar75 + fVar21 * fVar71
                   + fStack_b4 * fVar53 + fStack_104 * fVar27 + fStack_d4 * fVar45 +
                   fStack_e4 * fVar49 + fStack_c4 * fVar37 + fStack_74 * fVar57;
              auVar96._8_4_ =
                   auVar98._8_4_ * fStack_a0 + fStack_120 + auVar16._8_4_ * fVar76 + fVar22 * fVar72
                   + fStack_b0 * fVar54 + fStack_100 * fVar28 + fStack_d0 * fVar46 +
                   fStack_e0 * fVar50 + fStack_c0 * fVar38 + fStack_70 * fVar58;
              auVar96._12_4_ =
                   auVar98._12_4_ * fStack_9c + fStack_11c +
                   auVar16._12_4_ * fVar77 + fVar23 * fVar73 +
                   fStack_ac * fVar55 + fStack_fc * fVar29 + fStack_cc * fVar47 +
                   fStack_dc * fVar51 + fStack_bc * fVar39 + fStack_6c * fVar59;
              *(undefined1 (*) [16])(pfVar94 + 0xc) = auVar96;
              pfVar92 = pfVar92 + 0x20;
              pfVar93 = pfVar93 + 0x20;
              pfVar85 = pfVar85 + 0x20;
              pfVar94 = pfVar94 + 0x10;
              iVar87 = iVar87 + 4;
              uVar88 = uVar18 & 0xfffffffc;
            } while (iVar87 < (int)uVar18);
          }
          uVar86 = uVar88 | 1;
          while ((int)uVar86 < (int)uVar18) {
            auVar98 = *(undefined1 (*) [16])(pfVar92 + 8);
            auVar16 = *(undefined1 (*) [16])(pfVar93 + 8);
            auVar96 = *(undefined1 (*) [16])(pfVar85 + 8);
            fVar20 = pfVar92[1];
            fVar21 = pfVar92[2];
            fVar22 = pfVar92[3];
            fVar23 = pfVar92[5];
            fVar24 = pfVar92[6];
            fVar25 = pfVar92[7];
            fVar26 = pfVar93[1];
            fVar27 = pfVar93[2];
            fVar28 = pfVar93[3];
            fVar29 = pfVar93[5];
            fVar30 = pfVar93[6];
            fVar31 = pfVar93[7];
            fVar32 = pfVar85[1];
            fVar33 = pfVar85[2];
            fVar34 = pfVar85[3];
            fVar35 = pfVar85[5];
            fVar36 = pfVar85[6];
            fVar37 = pfVar85[7];
            fVar38 = pfVar92[0xc];
            fVar39 = pfVar92[0xd];
            fVar40 = pfVar92[0xe];
            fVar41 = pfVar92[0xf];
            fVar42 = pfVar92[0x10];
            fVar43 = pfVar92[0x11];
            fVar44 = pfVar92[0x12];
            fVar45 = pfVar92[0x13];
            fVar46 = pfVar93[0xc];
            fVar47 = pfVar93[0xd];
            fVar48 = pfVar93[0xe];
            fVar49 = pfVar93[0xf];
            fVar50 = pfVar93[0x10];
            fVar51 = pfVar93[0x11];
            fVar52 = pfVar93[0x12];
            fVar53 = pfVar93[0x13];
            fVar54 = pfVar85[0xc];
            fVar55 = pfVar85[0xd];
            fVar56 = pfVar85[0xe];
            fVar57 = pfVar85[0xf];
            fVar58 = pfVar85[0x10];
            fVar59 = pfVar85[0x11];
            fVar60 = pfVar85[0x12];
            fVar61 = pfVar85[0x13];
            *pfVar94 = auVar80._0_4_ * *pfVar92 + local_128 +
                       local_108 * pfVar92[4] + auVar98._0_4_ * auVar78._0_4_ +
                       fVar74 * *pfVar93 + auVar79._0_4_ * pfVar93[4] + auVar16._0_4_ * local_e8 +
                       fVar70 * *pfVar85 + local_b8 * pfVar85[4] + auVar96._0_4_ * local_78;
            pfVar94[1] = auVar80._4_4_ * fVar20 + fStack_124 +
                         fStack_104 * fVar23 + auVar98._4_4_ * auVar78._4_4_ +
                         fVar75 * fVar26 + auVar79._4_4_ * fVar29 + auVar16._4_4_ * fStack_e4 +
                         fVar71 * fVar32 + fStack_b4 * fVar35 + auVar96._4_4_ * fStack_74;
            pfVar94[2] = auVar80._8_4_ * fVar21 + fStack_120 +
                         fStack_100 * fVar24 + auVar98._8_4_ * auVar78._8_4_ +
                         fVar76 * fVar27 + auVar79._8_4_ * fVar30 + auVar16._8_4_ * fStack_e0 +
                         fVar72 * fVar33 + fStack_b0 * fVar36 + auVar96._8_4_ * fStack_70;
            pfVar94[3] = fStack_9c * fVar22 + fStack_11c +
                         fStack_fc * fVar25 + auVar98._12_4_ * fStack_bc +
                         fVar77 * fVar28 + fStack_cc * fVar31 + auVar16._12_4_ * fStack_dc +
                         fVar73 * fVar34 + fStack_ac * fVar37 + auVar96._12_4_ * fStack_6c;
            auVar97._0_4_ =
                 auVar98._0_4_ * auVar80._0_4_ + local_128 +
                 auVar16._0_4_ * fVar74 + auVar96._0_4_ * fVar70 +
                 local_108 * fVar38 + auVar79._0_4_ * fVar46 + local_b8 * fVar54 +
                 auVar78._0_4_ * fVar42 + local_e8 * fVar50 + local_78 * fVar58;
            auVar97._4_4_ =
                 auVar98._4_4_ * auVar80._4_4_ + fStack_124 +
                 auVar16._4_4_ * fVar75 + auVar96._4_4_ * fVar71 +
                 fStack_104 * fVar39 + auVar79._4_4_ * fVar47 + fStack_b4 * fVar55 +
                 auVar78._4_4_ * fVar43 + fStack_e4 * fVar51 + fStack_74 * fVar59;
            auVar97._8_4_ =
                 auVar98._8_4_ * auVar80._8_4_ + fStack_120 +
                 auVar16._8_4_ * fVar76 + auVar96._8_4_ * fVar72 +
                 fStack_100 * fVar40 + auVar79._8_4_ * fVar48 + fStack_b0 * fVar56 +
                 auVar78._8_4_ * fVar44 + fStack_e0 * fVar52 + fStack_70 * fVar60;
            auVar97._12_4_ =
                 auVar98._12_4_ * fStack_9c + fStack_11c +
                 auVar16._12_4_ * fVar77 + auVar96._12_4_ * fVar73 +
                 fStack_fc * fVar41 + fStack_cc * fVar49 + fStack_ac * fVar57 +
                 fStack_bc * fVar45 + fStack_dc * fVar53 + fStack_6c * fVar61;
            *(undefined1 (*) [16])(pfVar94 + 4) = auVar97;
            pfVar92 = pfVar92 + 0x10;
            pfVar93 = pfVar93 + 0x10;
            pfVar85 = pfVar85 + 0x10;
            pfVar94 = pfVar94 + 8;
            uVar86 = uVar88 + 3;
            uVar88 = uVar88 + 2;
          }
          iVar87 = uVar18 - uVar88;
          if (iVar87 != 0 && (int)uVar88 <= (int)uVar18) {
            lVar89 = 0;
            lVar84 = 0;
            do {
              pfVar2 = (float *)((long)pfVar92 + lVar84 * 2);
              pfVar5 = (float *)((long)pfVar92 + lVar84 * 2 + 0x10);
              pfVar6 = (float *)((long)pfVar92 + lVar84 * 2 + 0x20);
              pfVar11 = (float *)((long)pfVar93 + lVar84 * 2);
              pfVar7 = (float *)((long)pfVar93 + lVar84 * 2 + 0x10);
              pfVar8 = (float *)((long)pfVar93 + lVar84 * 2 + 0x20);
              pfVar3 = (float *)((long)pfVar85 + lVar84 * 2);
              pfVar9 = (float *)((long)pfVar85 + lVar84 * 2 + 0x10);
              pfVar10 = (float *)((long)pfVar85 + lVar84 * 2 + 0x20);
              auVar98._0_4_ =
                   local_a8 * *pfVar2 + local_128 + local_108 * *pfVar5 + auVar81._0_4_ * *pfVar6 +
                   fVar74 * *pfVar11 + auVar82._0_4_ * *pfVar7 + local_e8 * *pfVar8 +
                   fVar70 * *pfVar3 + local_b8 * *pfVar9 + local_78 * *pfVar10;
              auVar98._4_4_ =
                   fStack_a4 * pfVar2[1] + fStack_124 +
                   fStack_104 * pfVar5[1] + auVar81._4_4_ * pfVar6[1] +
                   fVar75 * pfVar11[1] + auVar82._4_4_ * pfVar7[1] + fStack_e4 * pfVar8[1] +
                   fVar71 * pfVar3[1] + fStack_b4 * pfVar9[1] + fStack_74 * pfVar10[1];
              auVar98._8_4_ =
                   fStack_a0 * pfVar2[2] + fStack_120 +
                   fStack_100 * pfVar5[2] + auVar81._8_4_ * pfVar6[2] +
                   fVar76 * pfVar11[2] + auVar82._8_4_ * pfVar7[2] + fStack_e0 * pfVar8[2] +
                   fVar72 * pfVar3[2] + fStack_b0 * pfVar9[2] + fStack_70 * pfVar10[2];
              auVar98._12_4_ =
                   fStack_9c * pfVar2[3] + fStack_11c +
                   fStack_fc * pfVar5[3] + fStack_bc * pfVar6[3] +
                   fVar77 * pfVar11[3] + fStack_cc * pfVar7[3] + fStack_dc * pfVar8[3] +
                   fVar73 * pfVar3[3] + fStack_ac * pfVar9[3] + fStack_6c * pfVar10[3];
              *(undefined1 (*) [16])((long)pfVar94 + lVar84) = auVar98;
              lVar84 = lVar84 + 0x10;
              lVar89 = lVar89 + -0x20;
              iVar87 = iVar87 + -1;
            } while (iVar87 != 0);
            pfVar94 = (float *)((long)pfVar94 + lVar84);
            pfVar92 = (float *)((long)pfVar92 - lVar89);
            pfVar93 = (float *)((long)pfVar93 - lVar89);
            pfVar85 = (float *)((long)pfVar85 - lVar89);
          }
          pfVar92 = pfVar92 + iVar83;
          pfVar93 = pfVar93 + iVar83;
          pfVar85 = pfVar85 + iVar83;
          iVar90 = iVar90 + 1;
        } while (iVar90 != iVar19);
      }
      lVar91 = lVar91 + 1;
    } while (lVar91 != iVar17);
  }
  return;
}

Assistant:

static void convdw3x3s2_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 4;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_load_ps(k0);
        __m128 _k01 = _mm_load_ps(k0 + 4);
        __m128 _k02 = _mm_load_ps(k0 + 8);
        __m128 _k10 = _mm_load_ps(k0 + 12);
        __m128 _k11 = _mm_load_ps(k0 + 16);
        __m128 _k12 = _mm_load_ps(k0 + 20);
        __m128 _k20 = _mm_load_ps(k0 + 24);
        __m128 _k21 = _mm_load_ps(k0 + 28);
        __m128 _k22 = _mm_load_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r24, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                __m128 _r06 = _mm_load_ps(r0 + 24);
                __m128 _r16 = _mm_load_ps(r1 + 24);
                __m128 _r26 = _mm_load_ps(r2 + 24);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r26, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r07 = _mm_load_ps(r0 + 28);
                __m128 _r17 = _mm_load_ps(r1 + 28);
                __m128 _r27 = _mm_load_ps(r2 + 28);
                __m128 _r08 = _mm_load_ps(r0 + 32);
                __m128 _r18 = _mm_load_ps(r1 + 32);
                __m128 _r28 = _mm_load_ps(r2 + 32);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r08, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r18, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm_store_ps(outptr0 + 12, _sum3);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm_store_ps(outptr0 + 4, _sum1);

                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _mm_store_ps(outptr0, _sum0);
                r0 += 2 * 4;
                r1 += 2 * 4;
                r2 += 2 * 4;
                outptr0 += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}